

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O2

string * ApprovalTests::FileUtils::getDirectory(string *__return_storage_ptr__,string *filePath)

{
  string local_40 [32];
  
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  ::std::__cxx11::string::rfind((string *)filePath,(ulong)local_40);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filePath);
  return __return_storage_ptr__;
}

Assistant:

std::string FileUtils::getDirectory(const std::string& filePath)
    {
        auto end = filePath.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto directory = filePath.substr(0, end);
        return directory;
    }